

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O1

void kratos::track_generators(Generator *top)

{
  undefined1 local_88 [8];
  MarkTrackedVisitor track_visitor;
  
  if ((top->context_ != (Context *)0x0) && (top->context_->track_generated_ == true)) {
    track_visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
    track_visitor.super_IRVisitor._8_8_ =
         &track_visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
    track_visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
    track_visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
    track_visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    track_visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
    track_visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    track_visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
    track_visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
    local_88 = (undefined1  [8])&PTR_visit_root_002b37c8;
    track_visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)0x0;
    track_visitor.track_lock_.super___mutex_base._M_mutex.__align = 0;
    track_visitor.track_lock_.super___mutex_base._M_mutex._8_8_ = 0;
    track_visitor.track_lock_.super___mutex_base._M_mutex._16_8_ = 0;
    track_visitor.track_lock_.super___mutex_base._M_mutex.__data.__list.__prev =
         (__pthread_internal_list *)0x0;
    IRVisitor::visit_generator_root_p((IRVisitor *)local_88,top);
    local_88 = (undefined1  [8])&PTR_visit_root_002b4da0;
    std::
    _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&track_visitor.super_IRVisitor.level);
  }
  return;
}

Assistant:

void track_generators(Generator* top) {
    // if we need to track if a generator has been touched for verilog
    if (top->context() && top->context()->track_generated()) {
        MarkTrackedVisitor track_visitor;
        track_visitor.visit_generator_root_p(top);
    }
}